

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  uint size;
  uint bucketCount;
  uint uVar1;
  EntryType *dst;
  int i;
  long lVar2;
  long lVar3;
  int *local_48;
  int *newBuckets;
  int local_34 [2];
  int modIndex;
  
  size = this->count * 2;
  local_34[0] = 0x4b;
  bucketCount = DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>::GetBucketSize(size,local_34);
  local_48 = (int *)0x0;
  newBuckets = (int *)0x0;
  if (bucketCount == this->bucketCount) {
    dst = AllocateEntries(this,size,true);
    Memory::
    CopyArray<JsUtil::WeakRefValueDictionaryEntry<Js::PathTypeSuccessorKey,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>>,Memory::RecyclerNonLeafAllocator>
              (dst,(long)(int)size,&this->entries,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    Memory::
    WriteBarrierPtr<JsUtil::WeakRefValueDictionaryEntry<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>_>
    ::WriteBarrierSet(&this->entries,dst);
    this->size = size;
    this->modFunctionIndex = local_34[0];
  }
  else {
    Allocate(this,&local_48,(EntryType **)&newBuckets,bucketCount,size);
    Memory::
    CopyArray<JsUtil::WeakRefValueDictionaryEntry<Js::PathTypeSuccessorKey,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>>,Memory::RecyclerNonLeafAllocator>
              ((WeakRefValueDictionaryEntry<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
                *)newBuckets,(long)(int)size,&this->entries,(long)this->count);
    this->modFunctionIndex = local_34[0];
    lVar3 = 8;
    for (lVar2 = 0; lVar2 < this->count; lVar2 = lVar2 + 1) {
      if (-2 < *(int *)((long)newBuckets + lVar3)) {
        uVar1 = GetBucket(*(int *)((long)newBuckets + lVar3 + 4) * 0x200 +
                          (uint)*(byte *)((long)newBuckets + lVar3 + 8) * 2 + 1,bucketCount,
                          this->modFunctionIndex);
        *(int *)((long)newBuckets + lVar3) = local_48[(int)uVar1];
        local_48[(int)uVar1] = (int)lVar2;
      }
      lVar3 = lVar3 + 0x18;
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,size,size - this->size);
    }
    Memory::WriteBarrierPtr<int>::WriteBarrierSet(&this->buckets,local_48);
    Memory::
    WriteBarrierPtr<JsUtil::WeakRefValueDictionaryEntry<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>_>
    ::WriteBarrierSet(&this->entries,
                      (WeakRefValueDictionaryEntry<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
                       *)newBuckets);
    this->bucketCount = bucketCount;
    this->size = size;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }